

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::gc(command_processor *this,fifo_path *param_1,broker_command *c)

{
  broker_command *c_local;
  fifo_path *param_1_local;
  command_processor *this_local;
  
  start_vacuum(&c->path);
  this->commits_ = this->commits_ + 1;
  brokerface::channel<pstore::descriptor_condition_variable>::
  publish<pstore::broker::command_processor::gc(pstore::brokerface::fifo_path_const&,pstore::broker::broker_command_const&)::__0>
            ((channel<pstore::descriptor_condition_variable> *)commits_channel,
             (anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void command_processor::gc (brokerface::fifo_path const &, broker_command const & c) {
            start_vacuum (c.path);

            ++commits_;
            commits_channel.publish ([this] () {
                std::ostringstream os;
                os << "{ \"commits\": " << commits_ << " }";
                std::string const & str = os.str ();
                PSTORE_ASSERT (json::is_valid (str));
                return str;
            });
        }